

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

bool __thiscall
FxStructMember::RequestAddress(FxStructMember *this,FCompileContext *ctx,bool *writable)

{
  uint uVar1;
  PType *pPVar2;
  PClass *pPVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  bool bVar7;
  
  uVar1 = this->membervar->Flags;
  if (((uVar1 >> 0xd & 1) != 0) || (this->AddressRequested = true, writable == (bool *)0x0))
  goto LAB_005336eb;
  if (this->AddressWritable == true) {
    if ((uVar1 & 0x10) != 0) {
      if ((uVar1 >> 0xe & 1) != 0) {
        iVar5 = FWadCollection::GetLumpFile(&Wads,ctx->Lump);
        if (iVar5 == 0) goto LAB_0053365d;
      }
      goto LAB_005336e7;
    }
LAB_0053365d:
    pPVar3 = PPointer::RegistrationInfo.MyClass;
    pPVar2 = this->classx->ValueType;
    if ((pPVar2->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
      iVar5 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
      (pPVar2->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
    }
    pPVar6 = (pPVar2->super_PTypeBase).super_DObject.Class;
    bVar7 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar3 && bVar7) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar7 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    bVar4 = true;
    if (bVar7) {
      bVar4 = *(byte *)&this->classx->ValueType[1].super_PTypeBase.super_DObject.Class ^ 1;
    }
  }
  else {
LAB_005336e7:
    bVar4 = false;
  }
  *writable = (bool)bVar4;
LAB_005336eb:
  return (uVar1 >> 0xd & 1) == 0;
}

Assistant:

bool FxStructMember::RequestAddress(FCompileContext &ctx, bool *writable)
{
	// Cannot take the address of metadata variables.
	if (membervar->Flags & VARF_Static)
	{
		return false;
	}
	AddressRequested = true;
	if (writable != nullptr) *writable = (AddressWritable && !ctx.CheckReadOnly(membervar->Flags) &&
											(!classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) || !static_cast<PPointer*>(classx->ValueType)->IsConst));
	return true;
}